

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

JavascriptBigInt * Js::JavascriptBigInt::Mul(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  JavascriptBigInt *pJVar1;
  
  if (((pbi1->m_length != 1) || (*(pbi1->m_digits).ptr != 0)) &&
     ((pbi2->m_length != 1 || (*(pbi2->m_digits).ptr != 0)))) {
    pJVar1 = MulAbsolute(pbi1,pbi2);
    if (pbi1->m_isNegative != pbi2->m_isNegative) {
      pJVar1->m_isNegative = true;
    }
    return pJVar1;
  }
  pJVar1 = CreateZero((((((pbi1->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr);
  return pJVar1;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::Mul(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        if (JavascriptBigInt::IsZero(pbi1) || JavascriptBigInt::IsZero(pbi2))
        {
            return JavascriptBigInt::CreateZero(pbi1->GetScriptContext());
        }
        JavascriptBigInt * result = JavascriptBigInt::MulAbsolute(pbi1, pbi2);
        if (pbi1->m_isNegative != pbi2->m_isNegative) 
        {
            result->m_isNegative = true;
        }
        return result;
    }